

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.hpp
# Opt level: O1

Uint32 __thiscall
Diligent::PipelineResourceSignatureGLImpl::GetImmutableSamplerIdx
          (PipelineResourceSignatureGLImpl *this,ResourceAttribs *Res)

{
  Uint32 ResIndex;
  PipelineResourceDesc *pPVar1;
  PipelineResourceAttribsType *pPVar2;
  char (*in_RCX) [88];
  uint uVar3;
  string msg;
  string local_40;
  
  ResIndex = *(Uint32 *)&Res->field_0x4;
  if ((int)ResIndex < 0) {
    uVar3 = ResIndex & 0x7fffffff;
  }
  else {
    uVar3 = 0xffffffff;
    if (ResIndex != 0x7fffffff) {
      pPVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                         (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                          ResIndex);
      if (pPVar1->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
        FormatString<char[26],char[77]>
                  (&local_40,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "GetResourceDesc(Res.SamplerInd).ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                   (char (*) [77])in_RCX);
        in_RCX = (char (*) [88])0x89;
        DebugAssertionFailed
                  (local_40._M_dataplus._M_p,"GetImmutableSamplerIdx",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/PipelineResourceSignatureGLImpl.hpp"
                   ,0x89);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
      pPVar2 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                         (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                          *(uint *)&Res->field_0x4 & 0x7fffffff);
      uVar3 = 0xffffffff;
      if ((int)*(uint *)&pPVar2->field_0x4 < 0) {
        uVar3 = *(uint *)&pPVar2->field_0x4 & 0x7fffffff;
      }
    }
  }
  if ((uVar3 != 0xffffffff) &&
     ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumImmutableSamplers <= uVar3)) {
    FormatString<char[26],char[88]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "ImtblSamIdx == InvalidImmutableSamplerIndex || ImtblSamIdx < GetImmutableSamplerCount()"
               ,in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetImmutableSamplerIdx",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/PipelineResourceSignatureGLImpl.hpp"
               ,0x8e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar3;
}

Assistant:

Uint32 GetImmutableSamplerIdx(const ResourceAttribs& Res) const
    {
        auto ImtblSamIdx = InvalidImmutableSamplerIndex;
        if (Res.IsImmutableSamplerAssigned())
            ImtblSamIdx = Res.SamplerInd;
        else if (Res.IsSamplerAssigned())
        {
            VERIFY_EXPR(GetResourceDesc(Res.SamplerInd).ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);
            const auto& SamAttribs = GetResourceAttribs(Res.SamplerInd);
            if (SamAttribs.IsImmutableSamplerAssigned())
                ImtblSamIdx = SamAttribs.SamplerInd;
        }
        VERIFY_EXPR(ImtblSamIdx == InvalidImmutableSamplerIndex || ImtblSamIdx < GetImmutableSamplerCount());
        return ImtblSamIdx;
    }